

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O3

bool __thiscall
nuraft::raft_server::handle_snapshot_sync_req(raft_server *this,snapshot_sync_req *req)

{
  ulong uVar1;
  element_type *peVar2;
  element_type *peVar3;
  context *pcVar4;
  element_type *peVar5;
  buffer *this_00;
  element_type *peVar6;
  long *plVar7;
  ulong uVar8;
  bool bVar9;
  int iVar10;
  ReturnCode RVar11;
  int iVar12;
  int *piVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  ptr<cluster_config> pVar17;
  ulong obj_id;
  ptr<snapshot> new_snp;
  ptr<cluster_config> c_conf;
  type local_da;
  undefined1 local_d9;
  undefined1 local_d8 [32];
  _Any_data local_b8;
  char local_a8 [16];
  ptr<snapshot> local_98;
  undefined1 local_88 [20];
  __int_type_conflict local_74;
  undefined4 local_70;
  thread local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  ulong local_38;
  
  uVar1 = req->offset_;
  bVar9 = req->done_;
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((uVar1 != 0 & (bVar9 ^ 1U)) == 0) {
    if ((peVar2 == (element_type *)0x0) || (iVar10 = (*peVar2->_vptr_logger[7])(), iVar10 < 4))
    goto LAB_001d6927;
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar15 = "first obj";
    if (uVar1 != 0) {
      pcVar15 = "";
    }
    pcVar14 = "last obj";
    if (bVar9 == false) {
      pcVar14 = "";
    }
    msg_if_given_abi_cxx11_
              ((string *)&local_b8,"save snapshot (idx %lu, term %lu) offset 0x%lx, %s %s",
               peVar3->last_log_idx_,peVar3->last_log_term_,req->offset_,pcVar15,pcVar14);
    (*peVar2->_vptr_logger[8])
              (peVar2,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_snapshot_sync_req",0x1d8,&local_b8);
  }
  else {
    if ((peVar2 == (element_type *)0x0) || (iVar10 = (*peVar2->_vptr_logger[7])(), iVar10 < 5))
    goto LAB_001d6927;
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)&local_b8,"save snapshot (idx %lu, term %lu) offset 0x%lx, %s %s",
               peVar3->last_log_idx_,peVar3->last_log_term_,req->offset_,"","");
    (*peVar2->_vptr_logger[8])
              (peVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_snapshot_sync_req",0x1e1,&local_b8);
  }
  if ((char *)local_b8._M_unused._0_8_ != local_a8) {
    operator_delete(local_b8._M_unused._M_object);
  }
LAB_001d6927:
  local_88._16_4_ = this->id_;
  local_74 = (this->leader_).super___atomic_base<int>._M_i;
  local_70 = 0xffffffff;
  pcVar4 = (this->ctx_)._M_t.
           super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
           super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
           super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
  local_68._M_id._M_thread = (id)(id)req;
  if ((pcVar4->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_88._0_4_ = SaveSnapshot;
    local_d8._0_8_ = local_88 + 0x10;
    RVar11 = (*(pcVar4->cb_func_).func._M_invoker)
                       ((_Any_data *)&pcVar4->cb_func_,(Type *)local_88,(Param **)local_d8);
    if (RVar11 == ReturnNull) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        return false;
      }
      iVar10 = (*peVar2->_vptr_logger[7])();
      if (iVar10 < 3) {
        return false;
      }
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&local_b8,"by callback, return false");
      (*peVar2->_vptr_logger[8])
                (peVar2,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_snapshot_sync_req",0x1e8,&local_b8);
      if ((char *)local_b8._M_unused._0_8_ == local_a8) {
        return false;
      }
      operator_delete(local_b8._M_unused._M_object);
      return false;
    }
  }
  LOCK();
  (this->receiving_snapshot_)._M_base._M_i = true;
  UNLOCK();
  LOCK();
  (this->et_cnt_receiving_snapshot_).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  if (((this->initialized_)._M_base._M_i & 1U) == 0) {
    LOCK();
    (this->initialized_)._M_base._M_i = true;
    UNLOCK();
  }
  peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->type_ == raw_binary) {
    peVar5 = (this->state_machine_).
             super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar5->_vptr_state_machine[10])
              (peVar5,peVar3,req->offset_,
               (req->data_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  else {
    local_b8._M_unused._0_8_ = (undefined8)req->offset_;
    this_00 = (req->data_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    buffer::pos(this_00,0);
    peVar5 = (this->state_machine_).
             super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar5->_vptr_state_machine[0xb])
              (peVar5,(req->snapshot_).
                      super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_b8,this_00,(ulong)(uVar1 == 0),bVar9);
    req->offset_ = (ulong)local_b8._M_unused._0_8_;
  }
  if (bVar9 == false) {
    return true;
  }
  pause_state_machine_exeuction(this,0);
  lVar16 = 0;
  while (bVar9 = wait_for_state_machine_pause(this,500), !bVar9) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar10 = (*peVar2->_vptr_logger[7])(), 3 < iVar10)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar16 = lVar16 + 1;
      msg_if_given_abi_cxx11_
                ((string *)&local_b8,
                 "waiting for state machine pause before applying snapshot: count %zu",lVar16);
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_snapshot_sync_req",0x20f,&local_b8);
      if ((char *)local_b8._M_unused._0_8_ != local_a8) {
        operator_delete(local_b8._M_unused._M_object);
      }
    }
  }
  if (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0) {
    do {
      local_d8._0_8_ = (Param *)0x0;
      local_d8._8_8_ = 500000000;
      do {
        iVar10 = nanosleep((timespec *)local_d8,(timespec *)local_d8);
        if (iVar10 != -1) break;
        piVar13 = __errno_location();
      } while (*piVar13 == 4);
    } while (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0);
  }
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx:536:28)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx:536:28)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  std::function<void_()>::function((function<void_()> *)&local_b8,(function<void_()> *)&local_60);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  LOCK();
  (this->receiving_snapshot_)._M_base._M_i = false;
  UNLOCK();
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((this->role_)._M_i == follower) {
    if ((peVar2 != (element_type *)0x0) && (iVar10 = (*peVar2->_vptr_logger[7])(), 3 < iVar10)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_d8,"successfully receive a snapshot (idx %lu term %lu) from leader"
                 ,peVar3->last_log_idx_,peVar3->last_log_term_);
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_snapshot_sync_req",0x229,local_d8);
      if ((Param *)local_d8._0_8_ != (Param *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
    }
    peVar6 = (this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar10 = (*peVar6->_vptr_log_store[0xe])
                       (peVar6,((req->snapshot_).
                                super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->last_log_idx_);
    if ((char)iVar10 == '\0') {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar10 = (*peVar2->_vptr_logger[7])(), 1 < iVar10)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_d8,
                   "failed to compact the log store after a snapshot is received, will ask the leader to retry"
                  );
        (*peVar2->_vptr_logger[8])
                  (peVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_snapshot_sync_req",0x25a,local_d8);
        if ((Param *)local_d8._0_8_ != (Param *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
      handle_snapshot_sync_req::ExecAutoResume::~ExecAutoResume((ExecAutoResume *)&local_b8);
      return false;
    }
    stop_election_timer(this);
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar10 = (*peVar2->_vptr_logger[7])(), 3 < iVar10)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_d8,
                 "successfully compact the log store, will now ask the statemachine to apply the snapshot"
                );
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_snapshot_sync_req",0x231,local_d8);
      if ((Param *)local_d8._0_8_ != (Param *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
    }
    peVar5 = (this->state_machine_).
             super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar10 = (*peVar5->_vptr_state_machine[0xc])
                       (peVar5,(req->snapshot_).
                               super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    if ((char)iVar10 != '\0') {
      reconfigure(this,&((req->snapshot_).
                         super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        last_config_);
      pVar17 = get_config((raft_server *)local_88);
      plVar7 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                            .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar7 + 0x18))
                (plVar7,CONCAT44(local_88._4_4_,local_88._0_4_),
                 pVar17.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      LOCK();
      (this->precommit_index_).super___atomic_base<unsigned_long>._M_i =
           ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->last_log_idx_;
      UNLOCK();
      LOCK();
      (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i =
           ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->last_log_idx_;
      UNLOCK();
      LOCK();
      (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i =
           ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->last_log_idx_;
      UNLOCK();
      LOCK();
      (this->lagging_sm_target_index_).super___atomic_base<unsigned_long>._M_i =
           ((req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->last_log_idx_;
      UNLOCK();
      plVar7 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                            .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar7 + 0x20))
                (plVar7,(this->state_).
                        super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      peVar3 = (req->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_d8._0_8_ = peVar3->last_log_idx_;
      local_38 = peVar3->last_log_term_;
      local_40.__d.__r = (duration)peVar3->size_;
      local_da = peVar3->type_;
      local_98.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::snapshot,std::allocator<nuraft::snapshot>,unsigned_long,unsigned_long,std::shared_ptr<nuraft::cluster_config>&,unsigned_long,nuraft::snapshot::type>
                (&local_98.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(snapshot **)&local_98,(allocator<nuraft::snapshot> *)&local_d9,
                 (unsigned_long *)local_d8,&local_38,(shared_ptr<nuraft::cluster_config> *)local_88,
                 (unsigned_long *)&local_40,&local_da);
      set_last_snapshot(this,&local_98);
      restart_election_timer(this);
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar10 = (*peVar2->_vptr_logger[7])(), 3 < iVar10)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar1 = (local_98.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                last_log_idx_;
        uVar8 = (local_98.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                last_log_term_;
        iVar10 = (*((this->log_store_).
                    super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_log_store[3])();
        iVar12 = (*((this->log_store_).
                    super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_log_store[2])();
        msg_if_given_abi_cxx11_
                  ((string *)local_d8,
                   "snapshot idx %lu term %lu is successfully applied, log start %lu last idx %lu",
                   uVar1,uVar8,CONCAT44(extraout_var,iVar10),CONCAT44(extraout_var_00,iVar12) + -1);
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_snapshot_sync_req",0x256,local_d8);
        if ((Param *)local_d8._0_8_ != (Param *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
      if (local_98.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      handle_snapshot_sync_req::ExecAutoResume::~ExecAutoResume((ExecAutoResume *)&local_b8);
      return true;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar10 = (*peVar2->_vptr_logger[7])(), 1 < iVar10)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_d8,
                 "failed to apply the snapshot after log compacted, to ensure the safety, will shutdown the system"
                );
      (*peVar2->_vptr_logger[8])
                (peVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_snapshot_sync_req",0x235,local_d8);
      if ((Param *)local_d8._0_8_ != (Param *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
    }
    plVar7 = *(long **)&(((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->state_mgr_
                        ).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar7 + 0x40))(plVar7,0xfffffff4);
  }
  else {
    if ((peVar2 != (element_type *)0x0) && (iVar10 = (*peVar2->_vptr_logger[7])(), 1 < iVar10)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_d8,"bad server role for applying a snapshot, exit for debugging");
      (*peVar2->_vptr_logger[8])
                (peVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_snapshot_sync_req",0x220,local_d8);
      if ((Param *)local_d8._0_8_ != (Param *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
    }
    plVar7 = *(long **)&(((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->state_mgr_
                        ).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar7 + 0x40))(plVar7,0xfffffff5);
  }
  exit(-1);
}

Assistant:

bool raft_server::handle_snapshot_sync_req(snapshot_sync_req& req) {
 try {
    // if offset == 0, it is the first object.
    bool is_first_obj = (req.get_offset()) ? false : true;
    bool is_last_obj = req.is_done();
    if (is_first_obj || is_last_obj) {
        // INFO level: log only first and last object.
        p_in("save snapshot (idx %" PRIu64 ", term %" PRIu64 ") offset 0x%" PRIx64
             ", %s %s",
             req.get_snapshot().get_last_log_idx(),
             req.get_snapshot().get_last_log_term(),
             req.get_offset(),
             (is_first_obj) ? "first obj" : "",
             (is_last_obj)  ? "last obj"  : "" );
    } else {
        // above DEBUG: log all.
        p_db("save snapshot (idx %" PRIu64 ", term %" PRIu64 ") offset 0x%" PRIx64
             ", %s %s",
             req.get_snapshot().get_last_log_idx(),
             req.get_snapshot().get_last_log_term(),
             req.get_offset(),
             (is_first_obj) ? "first obj" : "",
             (is_last_obj)  ? "last obj"  : "" );
    }

    cb_func::Param param(id_, leader_);
    param.ctx = &req;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::SaveSnapshot, &param);
    if (rc == CbReturnCode::ReturnNull) {
        p_wn("by callback, return false");
        return false;
    }

    // Set flag to avoid initiating election by this node.
    receiving_snapshot_ = true;
    et_cnt_receiving_snapshot_ = 0;

    // Set initialized flag
    if (!initialized_) initialized_ = true;

    if (req.get_snapshot().get_type() == snapshot::raw_binary) {
        // LCOV_EXCL_START
        // Raw binary type (original).
        state_machine_->save_snapshot_data(req.get_snapshot(),
                                           req.get_offset(),
                                           req.get_data());
        // LCOV_EXCL_STOP

    } else {
        // Logical object type.
        ulong obj_id = req.get_offset();
        buffer& buf = req.get_data();
        buf.pos(0);
        state_machine_->save_logical_snp_obj(req.get_snapshot(),
                                             obj_id,
                                             buf,
                                             is_first_obj,
                                             is_last_obj);
        req.set_offset(obj_id);
    }

    if (is_last_obj) {
        // let's pause committing in backgroud so it doesn't access logs
        // while they are being compacted
        pause_state_machine_exeuction();
        size_t wait_count = 0;
        while (!wait_for_state_machine_pause(500)) {
            p_in("waiting for state machine pause before applying snapshot: count %zu",
                 ++wait_count);
        }
        while (sm_commit_exec_in_progress_)
            std::this_thread::sleep_for(std::chrono::milliseconds(500));

        struct ExecAutoResume {
            explicit ExecAutoResume(std::function<void()> func) : clean_func_(func) {}
            ~ExecAutoResume() { clean_func_(); }
            std::function<void()> clean_func_;
        } exec_auto_resume([this](){ resume_state_machine_execution(); });


        receiving_snapshot_ = false;

        // Only follower will run this piece of code, but let's check it again
        if (role_ != srv_role::follower) {
            // LCOV_EXCL_START
            p_er("bad server role for applying a snapshot, exit for debugging");
            ctx_->state_mgr_->system_exit(raft_err::N11_not_follower_for_snapshot);
            ::exit(-1);
            // LCOV_EXCL_STOP
        }

        p_in( "successfully receive a snapshot (idx %" PRIu64 " term %" PRIu64
              ") from leader",
              req.get_snapshot().get_last_log_idx(),
              req.get_snapshot().get_last_log_term() );
        if (log_store_->compact(req.get_snapshot().get_last_log_idx())) {
            // The state machine will not be able to commit anything before the
            // snapshot is applied, so make this synchronously with election
            // timer stopped as usually applying a snapshot may take a very
            // long time
            stop_election_timer();
            p_in("successfully compact the log store, will now ask the "
                 "statemachine to apply the snapshot");
            if (!state_machine_->apply_snapshot(req.get_snapshot())) {
                // LCOV_EXCL_START
                p_er("failed to apply the snapshot after log compacted, "
                     "to ensure the safety, will shutdown the system");
                ctx_->state_mgr_->system_exit(raft_err::N12_apply_snapshot_failed);
                ::exit(-1);
                return false;
                // LCOV_EXCL_STOP
            }

            reconfigure(req.get_snapshot().get_last_config());

            ptr<cluster_config> c_conf = get_config();
            ctx_->state_mgr_->save_config(*c_conf);

            precommit_index_ = req.get_snapshot().get_last_log_idx();
            sm_commit_index_ = req.get_snapshot().get_last_log_idx();
            quick_commit_index_ = req.get_snapshot().get_last_log_idx();
            lagging_sm_target_index_ = req.get_snapshot().get_last_log_idx();

            ctx_->state_mgr_->save_state(*state_);

            ptr<snapshot> new_snp = cs_new<snapshot>
                                    ( req.get_snapshot().get_last_log_idx(),
                                      req.get_snapshot().get_last_log_term(),
                                      c_conf,
                                      req.get_snapshot().size(),
                                      req.get_snapshot().get_type() );
            set_last_snapshot(new_snp);

            restart_election_timer();
            p_in("snapshot idx %" PRIu64 " term %" PRIu64 " is successfully applied, "
                 "log start %" PRIu64 " last idx %" PRIu64,
                 new_snp->get_last_log_idx(),
                 new_snp->get_last_log_term(),
                 log_store_->start_index(),
                 log_store_->next_slot() - 1);

        } else {
            p_er("failed to compact the log store after a snapshot is received, "
                 "will ask the leader to retry");
            return false;
        }
    }

 } catch (...) {
    // LCOV_EXCL_START
    p_er("failed to handle snapshot installation due to system errors");
    ctx_->state_mgr_->system_exit(raft_err::N13_snapshot_install_failed);
    ::exit(-1);
    return false;
    // LCOV_EXCL_STOP
 }

    return true;
}